

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O0

void Kf_SetMergePairs(Kf_Set_t *p,Kf_Cut_t *pCut0,Kf_Cut_t *pCuts,int nCuts,int fArea)

{
  int iVar1;
  Kf_Cut_t *pCut;
  int local_3c;
  int i;
  Kf_Cut_t *pCutR;
  Kf_Cut_t *pCut1;
  int fArea_local;
  int nCuts_local;
  Kf_Cut_t *pCuts_local;
  Kf_Cut_t *pCut0_local;
  Kf_Set_t *p_local;
  
  Kf_HashPopulate(p,pCut0);
  for (pCutR = pCuts; pCutR < pCuts + nCuts; pCutR = pCutR + 1) {
    if ((pCut0->nLeaves + pCutR->nLeaves <= (int)(uint)p->nLutSize) ||
       (iVar1 = Kf_SetCountBits(pCut0->Sign | pCutR->Sign), iVar1 <= (int)(uint)p->nLutSize)) {
      Kf_HashCleanup(p,pCut0->nLeaves);
      local_3c = 0;
      while ((local_3c < pCutR->nLeaves &&
             (iVar1 = Kf_HashFindOrAdd(p,pCutR->pLeaves[local_3c]), iVar1 == 0))) {
        local_3c = local_3c + 1;
      }
      if (pCutR->nLeaves <= local_3c) {
        p->CutCount[1] = p->CutCount[1] + 1;
        iVar1 = Kf_SetRemoveDuplicates(p,p->nTEntries,pCut0->Sign | pCutR->Sign);
        if (iVar1 == 0) {
          iVar1 = p->nCuts;
          p->nCuts = iVar1 + 1;
          pCut = p->pCutsR + iVar1;
          pCut->nLeaves = p->nTEntries;
          for (local_3c = 0; local_3c < p->nTEntries; local_3c = local_3c + 1) {
            pCut->pLeaves[local_3c] = p->pTable[p->pPlace[local_3c]];
          }
          pCut->Sign = pCut0->Sign | pCutR->Sign;
          iVar1 = Abc_MaxInt(pCut0->Delay,pCutR->Delay);
          pCut->Delay = iVar1;
          pCut->Area = pCut0->Area + pCutR->Area;
          Kf_SetAddToList(p,pCut,0);
        }
      }
    }
  }
  Kf_HashCleanup(p,0);
  return;
}

Assistant:

static inline void Kf_SetMergePairs( Kf_Set_t * p, Kf_Cut_t * pCut0, Kf_Cut_t * pCuts, int nCuts, int fArea )
{
    Kf_Cut_t * pCut1, * pCutR;  int i;
    Kf_HashPopulate( p, pCut0 );
    for ( pCut1 = pCuts; pCut1 < pCuts + nCuts; pCut1++ )
    {
        if ( pCut0->nLeaves + pCut1->nLeaves > p->nLutSize && Kf_SetCountBits(pCut0->Sign | pCut1->Sign) > p->nLutSize )
            continue;
        Kf_HashCleanup( p, pCut0->nLeaves );
        for ( i = 0; i < pCut1->nLeaves; i++ )
            if ( Kf_HashFindOrAdd(p, pCut1->pLeaves[i]) )
                break;
        if ( i < pCut1->nLeaves )
            continue;
        p->CutCount[1]++;        
        if ( Kf_SetRemoveDuplicates(p, p->nTEntries, pCut0->Sign | pCut1->Sign) )
            continue;
        // create new cut
        pCutR = p->pCutsR + p->nCuts++;
        pCutR->nLeaves = p->nTEntries;
        for ( i = 0; i < p->nTEntries; i++ )
            pCutR->pLeaves[i] = p->pTable[p->pPlace[i]];
        pCutR->Sign  = pCut0->Sign | pCut1->Sign;
        pCutR->Delay = Abc_MaxInt(pCut0->Delay, pCut1->Delay);
        pCutR->Area  = pCut0->Area + pCut1->Area;
        // add new cut
        Kf_SetAddToList( p, pCutR, 0 );
    }
    Kf_HashCleanup( p, 0 );
}